

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O0

_Bool wc_unescape(char *output,char *wildcard)

{
  char *pcVar1;
  char *local_20;
  char *wildcard_local;
  char *output_local;
  
  pcVar1 = wildcard;
  wildcard_local = output;
  while( true ) {
    while( true ) {
      local_20 = pcVar1;
      if (*local_20 == '\0') {
        if (wildcard_local != (char *)0x0) {
          *wildcard_local = '\0';
        }
        return true;
      }
      if (*local_20 != '\\') break;
      pcVar1 = local_20 + 1;
      if (*pcVar1 != '\0') {
        if (wildcard_local != (char *)0x0) {
          *wildcard_local = *pcVar1;
          wildcard_local = wildcard_local + 1;
        }
        pcVar1 = local_20 + 2;
      }
    }
    if ((((*local_20 == '*') || (*local_20 == '?')) || (*local_20 == '[')) || (*local_20 == ']'))
    break;
    if (wildcard_local != (char *)0x0) {
      *wildcard_local = *local_20;
      wildcard_local = wildcard_local + 1;
    }
    pcVar1 = local_20 + 1;
  }
  return false;
}

Assistant:

bool wc_unescape(char *output, const char *wildcard)
{
    while (*wildcard) {
        if (*wildcard == '\\') {
            wildcard++;
            /* We are lenient about trailing backslashes in non-wildcards. */
            if (*wildcard) {
                if (output)
                    *output++ = *wildcard;
                wildcard++;
            }
        } else if (*wildcard == '*' || *wildcard == '?' ||
                   *wildcard == '[' || *wildcard == ']') {
            return false;              /* it's a wildcard! */
        } else {
            if (output)
                *output++ = *wildcard;
            wildcard++;
        }
    }
    if (output)
        *output = '\0';
    return true;                       /* it's clean */
}